

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseExpectedValues(WastParser *this,ExpectationPtr *expectation)

{
  Expectation *pEVar1;
  bool bVar2;
  Result RVar3;
  Expectation *pEVar4;
  ConstVector *consts;
  Location loc;
  Token local_60;
  
  GetToken(&local_60,this);
  bVar2 = PeekMatchLpar(this,Either);
  pEVar4 = (Expectation *)operator_new(0x48);
  pEVar4->_vptr_Expectation = (_func_int **)&PTR__Expectation_00195b88;
  (pEVar4->loc).filename._M_len = local_60.loc.filename._M_len;
  (pEVar4->loc).filename._M_str = local_60.loc.filename._M_str;
  (pEVar4->loc).field_1.field_1.offset = (size_t)local_60.loc.field_1.field_1.offset;
  *(undefined8 *)((long)&(pEVar4->loc).field_1 + 8) = local_60.loc.field_1._8_8_;
  consts = &pEVar4->expected;
  if (bVar2) {
    *(undefined8 *)&(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl
         = 0;
    (pEVar4->expected).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pEVar4->expected).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pEVar4->type_ = Either;
    pEVar4->_vptr_Expectation = (_func_int **)&PTR__Expectation_00195b28;
    RVar3 = ParseEither(this,consts);
  }
  else {
    *(undefined8 *)
     ((long)&(pEVar4->expected).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(pEVar4->expected).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)&(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl
         = 0;
    (pEVar4->expected).super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pEVar4->_vptr_Expectation = (_func_int **)&PTR__Expectation_00195ba8;
    RVar3 = ParseConstList(this,consts,Expectation);
  }
  if (RVar3.enum_ != Error) {
    pEVar1 = (expectation->_M_t).
             super___uniq_ptr_impl<wabt::Expectation,_std::default_delete<wabt::Expectation>_>._M_t.
             super__Tuple_impl<0UL,_wabt::Expectation_*,_std::default_delete<wabt::Expectation>_>.
             super__Head_base<0UL,_wabt::Expectation_*,_false>._M_head_impl;
    (expectation->_M_t).
    super___uniq_ptr_impl<wabt::Expectation,_std::default_delete<wabt::Expectation>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expectation_*,_std::default_delete<wabt::Expectation>_>.
    super__Head_base<0UL,_wabt::Expectation_*,_false>._M_head_impl = pEVar4;
    if (pEVar1 != (Expectation *)0x0) {
      (*pEVar1->_vptr_Expectation[1])();
    }
    pEVar4 = (Expectation *)0x0;
  }
  if (pEVar4 != (Expectation *)0x0) {
    (*pEVar4->_vptr_Expectation[1])(pEVar4);
  }
  return (Result)(uint)(RVar3.enum_ == Error);
}

Assistant:

Result WastParser::ParseExpectedValues(ExpectationPtr* expectation) {
  WABT_TRACE(ParseExpectedValues);
  Location loc = GetLocation();
  if (PeekMatchLpar(TokenType::Either)) {
    auto either = std::make_unique<EitherExpectation>(loc);
    CHECK_RESULT(ParseEither(&either->expected));
    *expectation = std::move(either);
  } else {
    auto values = std::make_unique<ValueExpectation>(loc);
    CHECK_RESULT(ParseConstList(&values->expected, ConstType::Expectation));
    *expectation = std::move(values);
  }
  return Result::Ok;
}